

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O2

int epoll_dispatch(event_base *base,timeval *tv)

{
  uint uVar1;
  undefined8 *puVar2;
  epoll_event *__events;
  event_base *base_00;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  int *piVar10;
  event_change *in_RDX;
  event_change *extraout_RDX;
  event_change *extraout_RDX_00;
  event_change *extraout_RDX_01;
  event_change *extraout_RDX_02;
  long lVar11;
  long lVar12;
  int local_68;
  itimerspec local_58;
  
  puVar2 = (undefined8 *)base->evbase;
  __events = (epoll_event *)*puVar2;
  if (*(int *)(puVar2 + 2) < 0) {
    if (tv == (timeval *)0x0) {
      local_68 = -1;
    }
    else {
      uVar7 = evutil_tv_to_msec_(tv);
      uVar8 = 2100000;
      if (uVar7 < 2100000) {
        uVar8 = uVar7;
      }
      local_68 = (int)uVar8;
      in_RDX = extraout_RDX;
    }
  }
  else {
    local_58.it_interval.tv_sec = 0;
    local_58.it_interval.tv_nsec = 0;
    if (tv == (timeval *)0x0) {
      local_58.it_value.tv_sec = 0;
      local_58.it_value.tv_nsec = 0;
      local_68 = -1;
    }
    else {
      local_58.it_value.tv_sec = tv->tv_sec;
      local_68 = -(uint)(local_58.it_value.tv_sec != 0 || tv->tv_usec != 0);
      local_58.it_value.tv_nsec = tv->tv_usec * 1000;
    }
    iVar5 = timerfd_settime(*(int *)(puVar2 + 2),0,&local_58,(itimerspec *)0x0);
    in_RDX = extraout_RDX_00;
    if (iVar5 < 0) {
      event_warn("timerfd_settime");
      in_RDX = extraout_RDX_01;
    }
  }
  base_00 = (event_base *)base->evbase;
  lVar11 = 0;
  for (lVar12 = 0; lVar12 < (base->changelist).n_changes; lVar12 = lVar12 + 1) {
    epoll_apply_one_change
              (base_00,(epollop *)((long)&((base->changelist).changes)->fd + lVar11),in_RDX);
    lVar11 = lVar11 + 0xc;
    in_RDX = extraout_RDX_02;
  }
  event_changelist_remove_all_(&base->changelist,base);
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  uVar6 = epoll_wait(*(int *)((long)puVar2 + 0xc),__events,*(int *)(puVar2 + 1),local_68);
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if (uVar6 == 0xffffffff) {
    piVar10 = __errno_location();
    iVar5 = 0;
    if (*piVar10 != 4) {
      event_warn("epoll_wait");
      iVar5 = -1;
    }
  }
  else {
    if (event_debug_logging_mask_ != 0) {
      event_debugx_("%s: epoll_wait reports %d","epoll_dispatch",(ulong)uVar6);
    }
    if (*(int *)(puVar2 + 1) < (int)uVar6) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/epoll.c"
                 ,0x1df,"res <= epollop->nevents","epoll_dispatch");
    }
    lVar11 = 0;
    uVar8 = 0;
    if (0 < (int)uVar6) {
      uVar8 = (ulong)uVar6;
    }
    for (; uVar8 * 0xc - lVar11 != 0; lVar11 = lVar11 + 0xc) {
      if (*(int *)(&__events->field_0x4 + lVar11) != *(int *)(puVar2 + 2)) {
        uVar1 = *(uint *)((long)&__events->events + lVar11);
        uVar4 = 6;
        if ((uVar1 & 0x18) == 0) {
          uVar3 = (ushort)uVar1 & 1;
          uVar4 = (ushort)uVar1 & 4;
          if ((uVar1 >> 0xd & 1) == 0) {
            uVar4 = uVar4 + uVar3 * 2;
            if (uVar4 == 0) goto LAB_0026d706;
          }
          else {
            uVar4 = uVar4 + uVar3 * 2 + 0x80;
          }
        }
        evmap_io_active_(base,*(int *)(&__events->field_0x4 + lVar11),uVar4 | 0x20);
      }
LAB_0026d706:
    }
    iVar5 = 0;
    if ((int)*(uint *)(puVar2 + 1) < 0x1000 && uVar6 == *(uint *)(puVar2 + 1)) {
      pvVar9 = event_mm_realloc_((void *)*puVar2,(long)(int)(uVar6 * 2) * 0xc);
      if (pvVar9 != (void *)0x0) {
        *puVar2 = pvVar9;
        *(uint *)(puVar2 + 1) = uVar6 * 2;
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

static int
epoll_dispatch(struct event_base *base, struct timeval *tv)
{
	struct epollop *epollop = base->evbase;
	struct epoll_event *events = epollop->events;
	int i, res;
	long timeout = -1;

#ifdef USING_TIMERFD
	if (epollop->timerfd >= 0) {
		struct itimerspec is;
		is.it_interval.tv_sec = 0;
		is.it_interval.tv_nsec = 0;
		if (tv == NULL) {
			/* No timeout; disarm the timer. */
			is.it_value.tv_sec = 0;
			is.it_value.tv_nsec = 0;
		} else {
			if (tv->tv_sec == 0 && tv->tv_usec == 0) {
				/* we need to exit immediately; timerfd can't
				 * do that. */
				timeout = 0;
			}
			is.it_value.tv_sec = tv->tv_sec;
			is.it_value.tv_nsec = tv->tv_usec * 1000;
		}
		/* TODO: we could avoid unnecessary syscalls here by only
		   calling timerfd_settime when the top timeout changes, or
		   when we're called with a different timeval.
		*/
		if (timerfd_settime(epollop->timerfd, 0, &is, NULL) < 0) {
			event_warn("timerfd_settime");
		}
	} else
#endif
	if (tv != NULL) {
		timeout = evutil_tv_to_msec_(tv);
		if (timeout < 0 || timeout > MAX_EPOLL_TIMEOUT_MSEC) {
			/* Linux kernels can wait forever if the timeout is
			 * too big; see comment on MAX_EPOLL_TIMEOUT_MSEC. */
			timeout = MAX_EPOLL_TIMEOUT_MSEC;
		}
	}

	epoll_apply_changes(base);
	event_changelist_remove_all_(&base->changelist, base);

	EVBASE_RELEASE_LOCK(base, th_base_lock);

	res = epoll_wait(epollop->epfd, events, epollop->nevents, timeout);

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	if (res == -1) {
		if (errno != EINTR) {
			event_warn("epoll_wait");
			return (-1);
		}

		return (0);
	}

	event_debug(("%s: epoll_wait reports %d", __func__, res));
	EVUTIL_ASSERT(res <= epollop->nevents);

	for (i = 0; i < res; i++) {
		int what = events[i].events;
		short ev = 0;
#ifdef USING_TIMERFD
		if (events[i].data.fd == epollop->timerfd)
			continue;
#endif

		if (what & (EPOLLHUP|EPOLLERR)) {
			ev = EV_READ | EV_WRITE;
		} else {
			if (what & EPOLLIN)
				ev |= EV_READ;
			if (what & EPOLLOUT)
				ev |= EV_WRITE;
			if (what & EPOLLRDHUP)
				ev |= EV_CLOSED;
		}

		if (!ev)
			continue;

		evmap_io_active_(base, events[i].data.fd, ev | EV_ET);
	}

	if (res == epollop->nevents && epollop->nevents < MAX_NEVENT) {
		/* We used all of the event space this time.  We should
		   be ready for more events next time. */
		int new_nevents = epollop->nevents * 2;
		struct epoll_event *new_events;

		new_events = mm_realloc(epollop->events,
		    new_nevents * sizeof(struct epoll_event));
		if (new_events) {
			epollop->events = new_events;
			epollop->nevents = new_nevents;
		}
	}

	return (0);
}